

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall cmCTestTestHandler::ComputeTestList(cmCTestTestHandler *this)

{
  byte bVar1;
  bool bVar2;
  reference it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  size_type sVar4;
  _Self local_b8;
  _Self local_b0;
  _Self local_a8;
  _Self local_a0 [3];
  reference local_88;
  cmCTestTestProperties *tp_1;
  iterator __end1_1;
  iterator __begin1_1;
  ListOfTests *__range1_1;
  ListOfTests finalList;
  int cnt;
  cmCTestTestProperties *tp;
  iterator __end1;
  iterator __begin1;
  ListOfTests *__range1;
  size_type sStack_20;
  int inREcnt;
  size_type tmsize;
  cmCTestTestHandler *this_local;
  
  tmsize = (size_type)this;
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::clear(&this->TestList);
  bVar2 = GetListOfTests(this);
  if (bVar2) {
    if ((this->RerunFailed & 1U) == 0) {
      sStack_20 = std::
                  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ::size(&this->TestList);
      __range1._4_4_ = 0;
      __end1 = std::
               vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
               ::begin(&this->TestList);
      tp = (cmCTestTestProperties *)
           std::
           vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           ::end(&this->TestList);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
                                         *)&tp), bVar2) {
        it = __gnu_cxx::
             __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
             ::operator*(&__end1);
        CheckLabelFilter(this,it);
        if ((it->IsInBasedOnREOptions & 1U) != 0) {
          __range1._4_4_ = __range1._4_4_ + 1;
        }
        __gnu_cxx::
        __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
        ::operator++(&__end1);
      }
      if ((this->UseUnion & 1U) == 0) {
        ExpandTestsToRunInformation(this,(long)__range1._4_4_);
      }
      else {
        ExpandTestsToRunInformation(this,(long)(int)sStack_20);
      }
      finalList.
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      __range1._4_4_ = 0;
      std::
      vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ::vector((vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                *)&__range1_1);
      __end1_1 = std::
                 vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                 ::begin(&this->TestList);
      tp_1 = (cmCTestTestProperties *)
             std::
             vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
             ::end(&this->TestList);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
                                 *)&tp_1), bVar2) {
        local_88 = __gnu_cxx::
                   __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
                   ::operator*(&__end1_1);
        finalList.
        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             finalList.
             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        if ((local_88->IsInBasedOnREOptions & 1U) != 0) {
          __range1._4_4_ = __range1._4_4_ + 1;
        }
        if ((this->UseUnion & 1U) == 0) {
          bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->TestsToRun);
          if ((bVar2) ||
             (bVar2 = ::cm::contains<std::vector<int,_std::allocator<int>_>,_int,_0>
                                (&this->TestsToRun,(int *)((long)&__range1 + 4)), bVar2)) {
            bVar1 = local_88->IsInBasedOnREOptions;
            goto joined_r0x001c1360;
          }
        }
        else {
          bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->TestsToRun);
          if ((!bVar2) &&
             (bVar2 = ::cm::contains<std::vector<int,_std::allocator<int>_>,_int,_0>
                                (&this->TestsToRun,
                                 (int *)((long)&finalList.
                                                super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4)), !bVar2)) {
            bVar1 = local_88->IsInBasedOnREOptions;
joined_r0x001c1360:
            if ((bVar1 & 1) == 0) goto LAB_001c14ae;
          }
          bVar2 = std::optional::operator_cast_to_bool((optional *)&this->TestsToRunByName);
          if (bVar2) {
            psVar3 = std::
                     optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator->(&this->TestsToRunByName);
            local_a0[0]._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(psVar3,&local_88->Name);
            psVar3 = std::
                     optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator->(&this->TestsToRunByName);
            local_a8._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(psVar3);
            bVar2 = std::operator==(local_a0,&local_a8);
            if (bVar2) goto LAB_001c14ae;
          }
          bVar2 = std::optional::operator_cast_to_bool((optional *)&this->TestsToExcludeByName);
          if (bVar2) {
            psVar3 = std::
                     optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator->(&this->TestsToExcludeByName);
            local_b0._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(psVar3,&local_88->Name);
            psVar3 = std::
                     optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator->(&this->TestsToExcludeByName);
            local_b8._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(psVar3);
            bVar2 = std::operator!=(&local_b0,&local_b8);
            if (bVar2) goto LAB_001c14ae;
          }
          local_88->Index =
               finalList.
               super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          std::
          vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
          ::push_back((vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                       *)&__range1_1,local_88);
        }
LAB_001c14ae:
        __gnu_cxx::
        __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
        ::operator++(&__end1_1);
      }
      UpdateForFixtures(this,(ListOfTests *)&__range1_1);
      sVar4 = std::
              vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
              ::size(&this->TestList);
      this->TotalNumberOfTests = sVar4;
      std::
      vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ::operator=(&this->TestList,
                  (vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                   *)&__range1_1);
      UpdateMaxTestNameWidth(this);
      this_local._7_1_ = 1;
      std::
      vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ::~vector((vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                 *)&__range1_1);
    }
    else {
      this_local._7_1_ = ComputeTestListForRerunFailed(this);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestTestHandler::ComputeTestList()
{
  this->TestList.clear(); // clear list of test
  if (!this->GetListOfTests()) {
    return false;
  }

  if (this->RerunFailed) {
    return this->ComputeTestListForRerunFailed();
  }

  cmCTestTestHandler::ListOfTests::size_type tmsize = this->TestList.size();
  // how many tests are in based on RegExp?
  int inREcnt = 0;
  for (cmCTestTestProperties& tp : this->TestList) {
    this->CheckLabelFilter(tp);
    if (tp.IsInBasedOnREOptions) {
      inREcnt++;
    }
  }
  // expand the test list based on the union flag
  if (this->UseUnion) {
    this->ExpandTestsToRunInformation(static_cast<int>(tmsize));
  } else {
    this->ExpandTestsToRunInformation(inREcnt);
  }
  // Now create a final list of tests to run
  int cnt = 0;
  inREcnt = 0;
  ListOfTests finalList;
  for (cmCTestTestProperties& tp : this->TestList) {
    cnt++;
    if (tp.IsInBasedOnREOptions) {
      inREcnt++;
    }

    if (this->UseUnion) {
      // if it is not in the list and not in the regexp then skip
      if ((!this->TestsToRun.empty() &&
           !cm::contains(this->TestsToRun, cnt)) &&
          !tp.IsInBasedOnREOptions) {
        continue;
      }
    } else {
      // is this test in the list of tests to run? If not then skip it
      if ((!this->TestsToRun.empty() &&
           !cm::contains(this->TestsToRun, inREcnt)) ||
          !tp.IsInBasedOnREOptions) {
        continue;
      }
    }

    if (this->TestsToRunByName) {
      if (this->TestsToRunByName->find(tp.Name) ==
          this->TestsToRunByName->end()) {
        continue;
      }
    }

    if (this->TestsToExcludeByName) {
      if (this->TestsToExcludeByName->find(tp.Name) !=
          this->TestsToExcludeByName->end()) {
        continue;
      }
    }

    tp.Index = cnt; // save the index into the test list for this test
    finalList.push_back(tp);
  }

  this->UpdateForFixtures(finalList);

  // Save the total number of tests before exclusions
  this->TotalNumberOfTests = this->TestList.size();
  // Set the TestList to the final list of all test
  this->TestList = finalList;

  this->UpdateMaxTestNameWidth();
  return true;
}